

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall
client_socket::client_socket
          (client_socket *this,epoll *ep,file_descriptor *fd,on_ready_t *on_disconnect,
          on_ready_t *on_read_ready,on_ready_t *on_write_ready)

{
  _Manager_type p_Var1;
  _Head_base<0UL,_client_socket::impl_*,_false> _Var2;
  file_descriptor local_a4;
  _Head_base<0UL,_client_socket::impl_*,_false> local_a0;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type local_80;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  
  local_a0._M_head_impl = (impl *)operator_new(0xa8);
  file_descriptor::file_descriptor(&local_a4,fd);
  _Var2._M_head_impl = local_a0._M_head_impl;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = on_disconnect->_M_invoker;
  p_Var1 = (on_disconnect->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(on_disconnect->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(on_disconnect->super__Function_base)._M_functor + 8);
    (on_disconnect->super__Function_base)._M_manager = (_Manager_type)0x0;
    on_disconnect->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  local_60 = on_read_ready->_M_invoker;
  p_Var1 = (on_read_ready->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(on_read_ready->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(on_read_ready->super__Function_base)._M_functor + 8);
    (on_read_ready->super__Function_base)._M_manager = (_Manager_type)0x0;
    on_read_ready->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var1;
  }
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (_Manager_type)0x0;
  local_80 = on_write_ready->_M_invoker;
  p_Var1 = (on_write_ready->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_98._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(on_write_ready->super__Function_base)._M_functor;
    local_98._8_8_ = *(undefined8 *)((long)&(on_write_ready->super__Function_base)._M_functor + 8);
    (on_write_ready->super__Function_base)._M_manager = (_Manager_type)0x0;
    on_write_ready->_M_invoker = (_Invoker_type)0x0;
    local_88 = p_Var1;
  }
  impl::impl(local_a0._M_head_impl,ep,&local_a4,(on_ready_t *)&local_58,(on_ready_t *)&local_78,
             (on_ready_t *)&local_98);
  (this->pimpl)._M_t.
  super___uniq_ptr_impl<client_socket::impl,_std::default_delete<client_socket::impl>_>._M_t.
  super__Tuple_impl<0UL,_client_socket::impl_*,_std::default_delete<client_socket::impl>_>.
  super__Head_base<0UL,_client_socket::impl_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  file_descriptor::~file_descriptor(&local_a4);
  return;
}

Assistant:

client_socket::client_socket(epoll& ep,
                             file_descriptor fd,
                             on_ready_t on_disconnect,
                             on_ready_t on_read_ready,
                             on_ready_t on_write_ready)
    : pimpl(new impl(ep, std::move(fd), std::move(on_disconnect), std::move(on_read_ready), std::move(on_write_ready)))
{}